

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_FreeLevelData(void)

{
  extsector_t *peVar1;
  FMiniBSP *this;
  polyblock_t *ppVar2;
  DInterpolation *pDVar3;
  FPolyObj *pFVar4;
  FPolyObj *pFVar5;
  int iVar6;
  polyblock_t *ppVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  FInterpolator::ClearInterpolations(&interpolator);
  (*Renderer->_vptr_FRenderer[0x17])();
  FPolyObj::ClearAllSubsectorLinks();
  SN_StopAllSequences();
  DThinker::DestroyAllThinkers();
  P_ClearPortals();
  FTagManager::Clear(&tagManager);
  wminfo.maxfrags = 0;
  level.total_secrets = 0;
  level.found_secrets = 0;
  level.total_items = 0;
  level.found_items = 0;
  level.total_monsters = 0;
  level.killed_monsters = 0;
  FBehavior::StaticUnloadModules();
  if (vertexes != (vertex_t *)0x0) {
    operator_delete__(vertexes);
    vertexes = (vertex_t *)0x0;
  }
  numvertexes = 0;
  if (segs != (seg_t *)0x0) {
    operator_delete__(segs);
    segs = (seg_t *)0x0;
  }
  numsegs = 0;
  if (glsegextras != (glsegextra_t *)0x0) {
    operator_delete__(glsegextras);
    glsegextras = (glsegextra_t *)0x0;
  }
  if (sectors == (sector_t *)0x0) goto LAB_004d26d6;
  peVar1 = sectors->e;
  if (peVar1 == (extsector_t *)0x0) {
LAB_004d26c9:
    operator_delete__(sectors);
  }
  else {
    lVar8 = *(long *)&peVar1[-1].vertices.Most;
    if (lVar8 != 0) {
      lVar10 = lVar8 * 0xb0;
      do {
        extsector_t::~extsector_t
                  ((extsector_t *)((long)&peVar1[-1].FakeFloor.Sectors.Array + lVar10));
        lVar10 = lVar10 + -0xb0;
      } while (lVar10 != 0);
    }
    operator_delete__(&peVar1[-1].vertices.Most,lVar8 * 0xb0 | 8);
    if (sectors != (sector_t *)0x0) goto LAB_004d26c9;
  }
  sectors = (sector_t *)0x0;
LAB_004d26d6:
  numsectors = 0;
  if ((gamenodes != (node_t *)0x0) && (gamenodes != nodes)) {
    operator_delete__(gamenodes);
  }
  if (gamesubsectors != subsectors && gamesubsectors != (subsector_t *)0x0) {
    operator_delete__(gamesubsectors);
  }
  if (subsectors != (subsector_t *)0x0) {
    lVar8 = 0x10;
    iVar6 = numsubsectors;
    for (lVar10 = 0; lVar10 < iVar6; lVar10 = lVar10 + 1) {
      this = *(FMiniBSP **)
              ((long)&((subsector_t *)(subsectors->portalcoverage + -4))->sector + lVar8);
      if (this != (FMiniBSP *)0x0) {
        FMiniBSP::~FMiniBSP(this);
        operator_delete(this,0x48);
        iVar6 = numsubsectors;
      }
      lVar8 = lVar8 + 0x60;
    }
    if (subsectors != (subsector_t *)0x0) {
      operator_delete__(subsectors);
    }
  }
  if (nodes != (node_t *)0x0) {
    operator_delete__(nodes);
  }
  gamesubsectors = (subsector_t *)0x0;
  subsectors = (subsector_t *)0x0;
  numgamesubsectors = 0;
  numsubsectors = 0;
  gamenodes = (node_t *)0x0;
  nodes = (node_t *)0x0;
  numgamenodes = 0;
  numnodes = 0;
  if (lines != (line_t *)0x0) {
    operator_delete__(lines);
    lines = (line_t *)0x0;
  }
  numlines = 0;
  if (sides != (side_t *)0x0) {
    operator_delete__(sides);
    sides = (side_t *)0x0;
  }
  numsides = 0;
  if (blockmaplump != (int *)0x0) {
    operator_delete__(blockmaplump);
    blockmaplump = (int *)0x0;
  }
  if (blocklinks != (FBlockNode **)0x0) {
    operator_delete__(blocklinks);
    blocklinks = (FBlockNode **)0x0;
  }
  if (PolyBlockMap != (polyblock_t **)0x0) {
    uVar9 = (ulong)(uint)(bmapheight * bmapwidth);
    while (0 < (int)uVar9) {
      uVar9 = uVar9 - 1;
      ppVar7 = PolyBlockMap[uVar9];
      while (ppVar7 != (polyblock_t *)0x0) {
        ppVar2 = ppVar7->next;
        operator_delete(ppVar7,0x18);
        ppVar7 = ppVar2;
      }
    }
    if (PolyBlockMap != (polyblock_t **)0x0) {
      operator_delete__(PolyBlockMap);
    }
    PolyBlockMap = (polyblock_t **)0x0;
  }
  if (rejectmatrix != (BYTE *)0x0) {
    operator_delete__(rejectmatrix);
    rejectmatrix = (BYTE *)0x0;
  }
  if (linebuffer != (line_t **)0x0) {
    operator_delete__(linebuffer);
    linebuffer = (line_t **)0x0;
  }
  pFVar5 = polyobjs;
  if (polyobjs != (FPolyObj *)0x0) {
    pFVar4 = polyobjs + -1;
    pDVar3 = polyobjs[-1].interpolation.field_0.p;
    if (pDVar3 != (DInterpolation *)0x0) {
      lVar8 = (long)pDVar3 * 0xf0;
      do {
        FPolyObj::~FPolyObj((FPolyObj *)((long)pFVar5[-1].Bounds.m_Box + lVar8 + -0x70));
        lVar8 = lVar8 + -0xf0;
      } while (lVar8 != 0);
    }
    operator_delete__(&pFVar4->interpolation,(long)pDVar3 * 0xf0 | 8);
    polyobjs = (FPolyObj *)0x0;
  }
  po_NumPolyobjs = 0;
  if (zones != (zone_t *)0x0) {
    operator_delete__(zones);
    zones = (zone_t *)0x0;
  }
  numzones = 0;
  P_FreeStrifeConversations();
  if (level.Scrolls != (FSectorScrollValues *)0x0) {
    operator_delete__(level.Scrolls);
    level.Scrolls = (FSectorScrollValues *)0x0;
  }
  P_ClearUDMFKeys();
  return;
}

Assistant:

void P_FreeLevelData ()
{
	interpolator.ClearInterpolations();	// [RH] Nothing to interpolate on a fresh level.
	Renderer->CleanLevelData();
	FPolyObj::ClearAllSubsectorLinks(); // can't be done as part of the polyobj deletion process.
	SN_StopAllSequences ();
	DThinker::DestroyAllThinkers ();
	P_ClearPortals();
	tagManager.Clear();
	level.total_monsters = level.total_items = level.total_secrets =
		level.killed_monsters = level.found_items = level.found_secrets =
		wminfo.maxfrags = 0;
		
	FBehavior::StaticUnloadModules ();
	if (vertexes != NULL)
	{
		delete[] vertexes;
		vertexes = NULL;
	}
	numvertexes = 0;
	if (segs != NULL)
	{
		delete[] segs;
		segs = NULL;
	}
	numsegs = 0;
	if (glsegextras != NULL)
	{
		delete[] glsegextras;
		glsegextras = NULL;
	}
	if (sectors != NULL)
	{
		delete[] sectors[0].e;
		delete[] sectors;
		sectors = NULL;
	}
	numsectors = 0;
	if (gamenodes != NULL && gamenodes != nodes)
	{
		delete[] gamenodes;
	}
	if (gamesubsectors != NULL && gamesubsectors != subsectors)
	{
		delete[] gamesubsectors;
	}
	if (subsectors != NULL)
	{
		for (int i = 0; i < numsubsectors; ++i)
		{
			if (subsectors[i].BSP != NULL)
			{
				delete subsectors[i].BSP;
			}
		}
		delete[] subsectors;
	}
	if (nodes != NULL)
	{
		delete[] nodes;
	}
	subsectors = gamesubsectors = NULL;
	numsubsectors = numgamesubsectors = 0;
	nodes = gamenodes = NULL;
	numnodes = numgamenodes = 0;
	if (lines != NULL)
	{
		delete[] lines;
		lines = NULL;
	}
	numlines = 0;
	if (sides != NULL)
	{
		delete[] sides;
		sides = NULL;
	}
	numsides = 0;

	if (blockmaplump != NULL)
	{
		delete[] blockmaplump;
		blockmaplump = NULL;
	}
	if (blocklinks != NULL)
	{
		delete[] blocklinks;
		blocklinks = NULL;
	}
	if (PolyBlockMap != NULL)
	{
		for (int i = bmapwidth*bmapheight-1; i >= 0; --i)
		{
			polyblock_t *link = PolyBlockMap[i];
			while (link != NULL)
			{
				polyblock_t *next = link->next;
				delete link;
				link = next;
			}
		}
		delete[] PolyBlockMap;
		PolyBlockMap = NULL;
	}
	if (rejectmatrix != NULL)
	{
		delete[] rejectmatrix;
		rejectmatrix = NULL;
	}
	if (linebuffer != NULL)
	{
		delete[] linebuffer;
		linebuffer = NULL;
	}
	if (polyobjs != NULL)
	{
		delete[] polyobjs;
		polyobjs = NULL;
	}
	po_NumPolyobjs = 0;
	if (zones != NULL)
	{
		delete[] zones;
		zones = NULL;
	}
	numzones = 0;
	P_FreeStrifeConversations ();
	if (level.Scrolls != NULL)
	{
		delete[] level.Scrolls;
		level.Scrolls = NULL;
	}
	P_ClearUDMFKeys();
}